

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

void __thiscall cmake::TruncateOutputLog(cmake *this,char *fname)

{
  cmState *this_00;
  int iVar1;
  string *psVar2;
  string fullPath;
  stat st;
  allocator<char> local_e9;
  string local_e8;
  string local_c8;
  stat local_a8;
  
  psVar2 = GetHomeOutputDirectory_abi_cxx11_(this);
  std::__cxx11::string::string((string *)&local_e8,(string *)psVar2);
  std::__cxx11::string::append((char *)&local_e8);
  std::__cxx11::string::append((char *)&local_e8);
  iVar1 = stat(local_e8._M_dataplus._M_p,&local_a8);
  if (iVar1 == 0) {
    this_00 = this->State;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"CMAKE_CACHEFILE_DIR",&local_e9);
    psVar2 = cmState::GetInitializedCacheValue(this_00,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    if (psVar2 == (string *)0x0) {
      cmsys::SystemTools::RemoveFile(&local_e8);
    }
  }
  std::__cxx11::string::~string((string *)&local_e8);
  return;
}

Assistant:

void cmake::TruncateOutputLog(const char* fname)
{
  std::string fullPath = this->GetHomeOutputDirectory();
  fullPath += "/";
  fullPath += fname;
  struct stat st;
  if (::stat(fullPath.c_str(), &st)) {
    return;
  }
  if (!this->State->GetInitializedCacheValue("CMAKE_CACHEFILE_DIR")) {
    cmSystemTools::RemoveFile(fullPath);
    return;
  }
  off_t fsize = st.st_size;
  const off_t maxFileSize = 50 * 1024;
  if (fsize < maxFileSize) {
    // TODO: truncate file
    return;
  }
}